

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_grammar.cpp
# Opt level: O2

ostream * Omega_h::operator<<(ostream *os,Grammar *g)

{
  int *piVar1;
  ostream *poVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  int i;
  int iVar5;
  int *symb;
  int *piVar6;
  
  std::operator<<(os,"symbols:\n");
  for (iVar5 = 0;
      iVar5 < (int)((ulong)((long)(g->symbol_names).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(g->symbol_names).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 5); iVar5 = iVar5 + 1
      ) {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)os,iVar5);
    poVar2 = std::operator<<(poVar2,": ");
    pvVar3 = at<std::__cxx11::string>(&g->symbol_names,iVar5);
    poVar2 = std::operator<<(poVar2,(string *)pvVar3);
    std::operator<<(poVar2,"\n");
  }
  std::operator<<(os,"productions:\n");
  for (iVar5 = 0;
      iVar5 < (int)((ulong)((long)(g->productions).
                                  super__Vector_base<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(g->productions).
                                 super__Vector_base<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 5); iVar5 = iVar5 + 1
      ) {
    pvVar4 = at<Omega_h::Grammar::Production>(&g->productions,iVar5);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)os,iVar5);
    poVar2 = std::operator<<(poVar2,": ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,pvVar4->lhs);
    std::operator<<(poVar2," ::=");
    piVar1 = (pvVar4->rhs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (piVar6 = (pvVar4->rhs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start; piVar6 != piVar1; piVar6 = piVar6 + 1) {
      poVar2 = std::operator<<(os,' ');
      std::ostream::operator<<((ostream *)poVar2,*piVar6);
    }
    std::operator<<(os,'\n');
  }
  std::operator<<(os,'\n');
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, Grammar const& g) {
  os << "symbols:\n";
  for (int i = 0; i < size(g.symbol_names); ++i) {
    os << i << ": " << at(g.symbol_names, i) << "\n";
  }
  os << "productions:\n";
  for (int i = 0; i < size(g.productions); ++i) {
    auto& prod = at(g.productions, i);
    os << i << ": " << prod.lhs << " ::=";
    for (auto& symb : prod.rhs) {
      os << ' ' << symb;
    }
    os << '\n';
  }
  os << '\n';
  return os;
}